

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11fwd.c
# Opt level: O3

void x11_closing(Plug *plug,PlugCloseType type,char *error_msg)

{
  char *err_message;
  
  if (type != PLUGCLOSE_NORMAL) {
    if (*(char *)((long)&plug[-5].vt + 6) == '\x01') {
      err_message = dupprintf("unable to connect to forwarded X server: %s",error_msg);
      x11_send_init_error((X11Connection *)(plug + -0xd),err_message);
      safefree(err_message);
    }
    (**(code **)((plug[-2].vt)->log + 0x10))(plug[-2].vt,error_msg);
    return;
  }
  if (plug[-2].vt != (PlugVtable *)0x0) {
    (**(code **)((plug[-2].vt)->log + 8))();
    return;
  }
  return;
}

Assistant:

static void x11_closing(Plug *plug, PlugCloseType type, const char *error_msg)
{
    struct X11Connection *xconn = container_of(
        plug, struct X11Connection, plug);

    if (type != PLUGCLOSE_NORMAL) {
        /*
         * Socket error. If we're still at the connection setup stage,
         * construct an X11 error packet passing on the problem.
         */
        if (xconn->no_data_sent_to_x_client) {
            char *err_message = dupprintf("unable to connect to forwarded "
                                          "X server: %s", error_msg);
            x11_send_init_error(xconn, err_message);
            sfree(err_message);
        }

        /*
         * Whether we did that or not, now we slam the connection
         * shut.
         */
        sshfwd_initiate_close(xconn->c, error_msg);
    } else {
        /*
         * Ordinary EOF received on socket. Send an EOF on the SSH
         * channel.
         */
        if (xconn->c)
            sshfwd_write_eof(xconn->c);
    }
}